

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::UdpPortListSyntax&,slang::syntax::UdpBodySyntax&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,UdpPortListSyntax *args_3,UdpBodySyntax *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token endprimitive;
  UdpDeclarationSyntax *this_00;
  Token *in_RCX;
  NamedBlockClauseSyntax *in_RDX;
  undefined8 in_R8;
  UdpBodySyntax *in_R9;
  Token *in_stack_00000008;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (UdpDeclarationSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  endprimitive.info = (Info *)in_RCX;
  endprimitive.kind = (short)in_R8;
  endprimitive._2_1_ = (char)((ulong)in_R8 >> 0x10);
  endprimitive.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  endprimitive.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::UdpDeclarationSyntax::UdpDeclarationSyntax
            (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000010,
             *in_RCX,*in_stack_00000008,(UdpPortListSyntax *)(in_RDX->super_SyntaxNode).parent,in_R9
             ,endprimitive,in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }